

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

string * vera::toUpper(string *__return_storage_ptr__,string *_string)

{
  char cVar1;
  int iVar2;
  int i;
  long lVar3;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)_string);
  for (lVar3 = 0; cVar1 = (_string->_M_dataplus)._M_p[lVar3], cVar1 != '\0'; lVar3 = lVar3 + 1) {
    iVar2 = toupper((int)cVar1);
    (__return_storage_ptr__->_M_dataplus)._M_p[lVar3] = (char)iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUpper(const std::string& _string) {
    std::string std = _string;
    for (int i = 0; _string[i]; i++) {
        std[i] = toupper(_string[i]);
    }
    return std;
}